

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

void os_time_ns(time_t *sec,long *ns)

{
  __enable_if_is_duration<std::chrono::duration<long>_> __lhs;
  rep rVar1;
  rep *in_RSI;
  long *in_RDI;
  duration now;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffb8;
  duration<long,std::ratio<1l,1l>> local_40 [8];
  rep local_38;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_ffffffffffffffd0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  rep local_18;
  rep *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_18 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch(&local_20);
  __lhs = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                    (in_stack_ffffffffffffffb8);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                    ((duration<long,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffd8);
  *local_8 = rVar1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>(local_40,local_8);
  local_38 = (rep)std::chrono::operator-(__lhs.__r,in_stack_ffffffffffffffd0.__r);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
            (in_stack_ffffffffffffffb8);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&stack0xffffffffffffffd0);
  *local_10 = rVar1;
  return;
}

Assistant:

void
os_time_ns( os_time_t* sec, long* ns )
{
    using namespace std::chrono;
    // C++ does not guarantee that the system clock's epoch is the same as
    // the Unix Epoch, but it's the de-facto standard in all compilers.
    const auto now = system_clock::now().time_since_epoch();
    *sec = duration_cast<seconds>(now).count();
    *ns = duration_cast<nanoseconds>(now - seconds(*sec)).count();
}